

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupFlopClass(Gia_Man_t *p,int iClass)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFlopClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x4d4,"Gia_Man_t *Gia_ManDupFlopClass(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < p->vCis->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar6 = Gia_ManCi(p,iVar7);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar1;
  }
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar2 = Vec_IntEntry(p->vFlopClasses,iVar7);
    if (iVar2 != iClass) {
      uVar1 = Gia_ManAppendCi(p_00);
      pGVar6->Value = uVar1;
    }
  }
  iVar7 = 0;
  for (iVar2 = 0; iVar2 < p->nRegs; iVar2 = iVar2 + 1) {
    pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar2);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar3 = Vec_IntEntry(p->vFlopClasses,iVar2);
    if (iVar3 == iClass) {
      uVar1 = Gia_ManAppendCi(p_00);
      pGVar6->Value = uVar1;
      iVar7 = iVar7 + 1;
    }
  }
  for (iVar2 = 0; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
    pGVar6 = Gia_ManObj(p,iVar2);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
      iVar3 = Gia_ObjFanin0Copy(pGVar6);
      iVar4 = Gia_ObjFanin1Copy(pGVar6);
      uVar1 = Gia_ManAppendAnd(p_00,iVar3,iVar4);
      pGVar6->Value = uVar1;
    }
  }
  for (iVar2 = 0; iVar2 < p->vCos->nSize - p->nRegs; iVar2 = iVar2 + 1) {
    pGVar6 = Gia_ManCo(p,iVar2);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjFanin0Copy(pGVar6);
    Gia_ManAppendCo(p_00,iVar3);
  }
  for (iVar2 = 0; iVar2 < p->nRegs; iVar2 = iVar2 + 1) {
    pGVar6 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar2);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar3 = Vec_IntEntry(p->vFlopClasses,iVar2);
    if (iVar3 != iClass) {
      iVar3 = Gia_ObjFanin0Copy(pGVar6);
      Gia_ManAppendCo(p_00,iVar3);
    }
  }
  iVar2 = 0;
  for (iVar3 = 0; iVar3 < p->nRegs; iVar3 = iVar3 + 1) {
    pGVar6 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    iVar4 = Vec_IntEntry(p->vFlopClasses,iVar3);
    if (iVar4 == iClass) {
      iVar4 = Gia_ObjFanin0Copy(pGVar6);
      Gia_ManAppendCo(p_00,iVar4);
      iVar2 = iVar2 + 1;
    }
  }
  if (iVar7 == iVar2) {
    Gia_ManSetRegNum(p_00,iVar7);
    return p_00;
  }
  __assert_fail("Counter1 == Counter2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0x4ec,"Gia_Man_t *Gia_ManDupFlopClass(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupFlopClass( Gia_Man_t * p, int iClass )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i, Counter1 = 0, Counter2 = 0;
    assert( p->vFlopClasses != NULL );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) != iClass )
            pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) == iClass )
            pObj->Value = Gia_ManAppendCi( pNew ), Counter1++;
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) != iClass )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(p->vFlopClasses, i) == iClass )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ), Counter2++;
    assert( Counter1 == Counter2 );
    Gia_ManSetRegNum( pNew, Counter1 );
    return pNew;
}